

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O2

Decorator * ftxui::operator|(Decorator *__return_storage_ptr__,Decorator *a,Decorator *b)

{
  _Invoker_type p_Var1;
  _Manager_type p_Var2;
  _Invoker_type p_Var3;
  _Manager_type p_Var4;
  undefined8 *puVar5;
  _Any_data local_b8;
  _Manager_type local_a8;
  _Invoker_type p_Stack_a0;
  _Any_data local_98;
  _Manager_type local_88;
  _Invoker_type p_Stack_80;
  void *local_78;
  undefined8 uStack_70;
  _Manager_type local_68;
  _Invoker_type p_Stack_60;
  void *local_58;
  undefined8 uStack_50;
  _Manager_type local_48;
  _Invoker_type p_Stack_40;
  
  local_98._M_unused._M_object = (void *)0x0;
  local_98._8_8_ = 0;
  local_88 = (_Manager_type)0x0;
  p_Var1 = a->_M_invoker;
  p_Var2 = (a->super__Function_base)._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    local_98._M_unused._0_8_ = (undefined8)*(undefined8 *)&(a->super__Function_base)._M_functor;
    local_98._8_8_ = *(undefined8 *)((long)&(a->super__Function_base)._M_functor + 8);
    (a->super__Function_base)._M_manager = (_Manager_type)0x0;
    a->_M_invoker = (_Invoker_type)0x0;
    local_88 = p_Var2;
  }
  local_b8._M_unused._M_object = (void *)0x0;
  local_b8._8_8_ = 0;
  local_a8 = (_Manager_type)0x0;
  p_Var3 = b->_M_invoker;
  p_Var4 = (b->super__Function_base)._M_manager;
  if (p_Var4 != (_Manager_type)0x0) {
    local_b8._M_unused._0_8_ = (undefined8)*(undefined8 *)&(b->super__Function_base)._M_functor;
    local_b8._8_8_ = *(undefined8 *)((long)&(b->super__Function_base)._M_functor + 8);
    (b->super__Function_base)._M_manager = (_Manager_type)0x0;
    b->_M_invoker = (_Invoker_type)0x0;
    local_a8 = p_Var4;
  }
  local_68 = (_Manager_type)0x0;
  local_78 = (void *)0x0;
  uStack_70 = 0;
  p_Stack_80 = p_Var1;
  if (p_Var2 != (_Manager_type)0x0) {
    local_78 = local_98._M_unused._M_object;
    uStack_70 = local_98._8_8_;
    local_88 = (_Manager_type)0x0;
    p_Stack_80 = (_Invoker_type)0x0;
    local_68 = p_Var2;
  }
  local_48 = (_Manager_type)0x0;
  local_58 = (void *)0x0;
  uStack_50 = 0;
  p_Stack_a0 = p_Var3;
  if (p_Var4 != (_Manager_type)0x0) {
    local_58 = local_b8._M_unused._M_object;
    uStack_50 = local_b8._8_8_;
    local_a8 = (_Manager_type)0x0;
    p_Stack_a0 = (_Invoker_type)0x0;
    local_48 = p_Var4;
  }
  (__return_storage_ptr__->super__Function_base)._M_manager = (_Manager_type)0x0;
  __return_storage_ptr__->_M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(__return_storage_ptr__->super__Function_base)._M_functor = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
  p_Stack_60 = p_Var1;
  p_Stack_40 = p_Var3;
  puVar5 = (undefined8 *)operator_new(0x40);
  puVar5[2] = 0;
  *puVar5 = 0;
  puVar5[1] = 0;
  puVar5[3] = p_Var1;
  if (p_Var2 != (_Manager_type)0x0) {
    *puVar5 = local_78;
    puVar5[1] = uStack_70;
    puVar5[2] = p_Var2;
    local_68 = (_Manager_type)0x0;
    p_Stack_60 = (_Invoker_type)0x0;
  }
  puVar5[6] = 0;
  puVar5[4] = 0;
  puVar5[5] = 0;
  puVar5[7] = p_Var3;
  if (p_Var4 != (_Manager_type)0x0) {
    puVar5[4] = local_58;
    puVar5[5] = uStack_50;
    puVar5[6] = p_Var4;
    local_48 = (_Manager_type)0x0;
    p_Stack_40 = (_Invoker_type)0x0;
  }
  *(undefined8 **)&(__return_storage_ptr__->super__Function_base)._M_functor = puVar5;
  __return_storage_ptr__->_M_invoker =
       std::
       _Function_handler<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ArthurSonzogni[P]ftxui-starter/build_O2/_deps/ftxui-src/src/ftxui/dom/util.cpp:22:10)>
       ::_M_invoke;
  (__return_storage_ptr__->super__Function_base)._M_manager =
       std::
       _Function_handler<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ArthurSonzogni[P]ftxui-starter/build_O2/_deps/ftxui-src/src/ftxui/dom/util.cpp:22:10)>
       ::_M_manager;
  (anonymous_namespace)::
  compose(std::function<std::shared_ptr<ftxui::Node>(std::shared_ptr<ftxui::Node>)>,std::function<std::shared_ptr<ftxui::Node>(std::shared_ptr<ftxui::Node>)>)
  ::$_0::~__0((__0 *)&local_78);
  std::_Function_base::~_Function_base((_Function_base *)&local_b8);
  std::_Function_base::~_Function_base((_Function_base *)&local_98);
  return __return_storage_ptr__;
}

Assistant:

Decorator operator|(Decorator a, Decorator b) {
  return compose(std::move(a),  //
                 std::move(b));
}